

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

char * __thiscall
Memory::Recycler::LargeAlloc<false>
          (Recycler *this,HeapInfo *heap,size_t size,ObjectInfoBits attributes)

{
  code *pcVar1;
  bool bVar2;
  ConfigFlagsTable *pCVar3;
  undefined8 *in_FS_OFFSET;
  char *local_38;
  char *addr;
  size_t limit;
  ObjectInfoBits attributes_local;
  size_t size_local;
  HeapInfo *heap_local;
  Recycler *this_local;
  
  if ((attributes & InternalObjectInfoBitMask) != attributes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x54f,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  pCVar3 = GetRecyclerFlagsTable(this);
  if ((ulong)((long)pCVar3->MaxSingleAllocSizeInMB << 0x14) <= size) {
    pCVar3 = GetRecyclerFlagsTable(this);
    if ((pCVar3->EnableFatalErrorOnOOM & 1U) != 0) {
      bVar2 = IsMemProtectMode(this);
      if (bVar2) {
        MemGCSingleAllocationLimit_unrecoverable_error();
      }
      else {
        RecyclerSingleAllocationLimit_unrecoverable_error();
      }
    }
    OutOfMemory(this);
  }
  local_38 = TryLargeAlloc(this,heap,size,attributes,false);
  if (local_38 == (char *)0x0) {
    CollectNow<(Memory::CollectionFlags)16384>(this);
    local_38 = TryLargeAlloc(this,heap,size,attributes,false);
    if (local_38 == (char *)0x0) {
      OutOfMemory(this);
    }
  }
  (this->autoHeap).uncollectedAllocBytes = size + (this->autoHeap).uncollectedAllocBytes;
  return local_38;
}

Assistant:

char*
Recycler::LargeAlloc(HeapInfo* heap, size_t size, ObjectInfoBits attributes)
{
    Assert((attributes & InternalObjectInfoBitMask) == attributes);

#if ENABLE_DEBUG_CONFIG_OPTIONS
    size_t limit = (size_t)GetRecyclerFlagsTable().MaxSingleAllocSizeInMB * 1024 * 1024;
#else
    size_t limit = (size_t)CONFIG_FLAG(MaxSingleAllocSizeInMB) * 1024 * 1024;
#endif

    if (size >= limit)
    {
        if (nothrow == false)
        {
#if ENABLE_DEBUG_CONFIG_OPTIONS
            if (GetRecyclerFlagsTable().EnableFatalErrorOnOOM)
            {
                if (this->IsMemProtectMode())
                {
                    MemGCSingleAllocationLimit_unrecoverable_error();
                }
                else
                {
                    RecyclerSingleAllocationLimit_unrecoverable_error();
                }
            }
#endif
            this->OutOfMemory();
        }
        else
        {
            return nullptr;
        }
    }

    char * addr = TryLargeAlloc(heap, size, attributes, nothrow);
    if (addr == nullptr)
    {
        // Force a collection and try to allocate again.
        this->CollectNow<CollectNowForceInThread>();
        addr = TryLargeAlloc(heap, size, attributes, nothrow);
        if (addr == nullptr)
        {
            if (nothrow == false)
            {
                // Still fails, we are out of memory
                // Since nothrow is false, it's okay to throw here
                this->OutOfMemory();
            }
            else
            {
                return nullptr;
            }
        }
    }
    autoHeap.uncollectedAllocBytes += size;
    return addr;
}